

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::V2MessageLite::Clear(V2MessageLite *this)

{
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x3) !=
      (undefined1  [16])0x0) {
    *(undefined8 *)((long)&this->field_0 + 8) = 0x100000000;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void V2MessageLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.V2MessageLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    _impl_.int_field_ = 0;
    _impl_.enum_field_ = 1;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}